

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Materials.cpp
# Opt level: O2

SP __thiscall pbrt::SemanticParser::createMaterial_fourier(SemanticParser *this,SP *in)

{
  long lVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  bool bVar3;
  _Rb_tree_node_base *p_Var4;
  runtime_error *this_00;
  long *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  SP SVar5;
  SP mat;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string name;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
  it;
  
  std::make_shared<pbrt::FourierMaterial,std::__cxx11::string&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mat);
  lVar1 = *in_RDX;
  p_Var4 = *(_Rb_tree_node_base **)(lVar1 + 0x18);
  do {
    _Var2._M_pi = mat.super___shared_ptr<pbrt::FourierMaterial,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    if (p_Var4 == (_Rb_tree_node_base *)(lVar1 + 8)) {
      mat.super___shared_ptr<pbrt::FourierMaterial,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           mat.super___shared_ptr<pbrt::FourierMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Var2._M_pi;
      mat.super___shared_ptr<pbrt::FourierMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&mat.super___shared_ptr<pbrt::FourierMaterial,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      SVar5.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           extraout_RDX._M_pi;
      SVar5.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (SP)SVar5.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>;
    }
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
    ::pair(&it,(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
                *)(p_Var4 + 1));
    std::__cxx11::string::string((string *)&name,(string *)&it);
    bVar3 = std::operator==(&name,"bsdffile");
    if (bVar3) {
      syntactic::ParamSet::getParamString(&local_c0,(ParamSet *)*in_RDX,&name);
      std::__cxx11::string::operator=
                ((string *)
                 &(mat.super___shared_ptr<pbrt::FourierMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ->fileName,(string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
    }
    else {
      bVar3 = std::operator==(&name,"type");
      if (!bVar3) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_a0,"un-handled fourier-material parameter \'",&it.first);
        std::operator+(&local_c0,&local_a0,"\'");
        std::runtime_error::runtime_error(this_00,(string *)&local_c0);
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    std::__cxx11::string::~string((string *)&name);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
    ::~pair(&it);
    p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
  } while( true );
}

Assistant:

Material::SP SemanticParser::createMaterial_fourier(pbrt::syntactic::Material::SP in)
  {
    FourierMaterial::SP mat = std::make_shared<FourierMaterial>(in->name);
    for (auto it : in->param) {
      std::string name = it.first;
      if (name == "bsdffile") {
        mat->fileName = in->getParamString(name);
      }
      else if (name == "type") {
        /* ignore */
      } else
        throw std::runtime_error("un-handled fourier-material parameter '"+it.first+"'");
    };
    return mat;
  }